

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O3

int handshake_0405(lws_context *context,lws *wsi)

{
  char cVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  lws_http_mount *plVar6;
  uchar *puVar7;
  uchar **ppuVar8;
  uchar *puVar9;
  lws_process_html_args args;
  uchar hash [20];
  uchar *local_60;
  int local_54;
  uchar local_48 [24];
  
  cVar1 = wsi->tsi;
  iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_HOST);
  if ((iVar3 == 0) || (iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_KEY), iVar3 == 0)) {
    pcVar5 = "handshake_04 missing pieces\n";
    iVar3 = 8;
  }
  else {
    iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_KEY);
    if (0x7f < iVar3) {
      _lws_log(2,"Client key too long %d\n",0x80);
      return -1;
    }
    puVar2 = context->pt[cVar1].serv_buf;
    pcVar5 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_KEY);
    uVar4 = sprintf((char *)puVar2,"%s258EAFA5-E914-47DA-95CA-C5AB0DC85B11",pcVar5);
    lws_SHA1(context->pt[cVar1].serv_buf,(ulong)uVar4,local_48);
    uVar4 = lws_b64_encode_string
                      ((char *)local_48,0x14,(char *)context->pt[cVar1].serv_buf,
                       context->pt_serv_buf_size);
    if (-1 < (int)uVar4) {
      iVar3 = lws_ensure_user_space(wsi);
      if (iVar3 != 0) {
        return -1;
      }
      ppuVar8 = &context->pt[cVar1].serv_buf;
      puVar9 = *ppuVar8;
      puVar2 = puVar9 + 400;
      memcpy(puVar2,
             "HTTP/1.1 101 Switching Protocols\r\nUpgrade: WebSocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
             ,0x62);
      strcpy((char *)(puVar9 + 0x1f1),(char *)*ppuVar8);
      puVar7 = puVar9 + (ulong)uVar4 + 0x1f1;
      iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_PROTOCOL);
      if (((iVar3 != 0) && (pcVar5 = ((wsi->a).protocol)->name, pcVar5 != (char *)0x0)) &&
         (*pcVar5 != '\0')) {
        builtin_memcpy(puVar9 + (ulong)uVar4 + 0x1fc,"cket-Pro",8);
        builtin_memcpy(puVar9 + (ulong)uVar4 + 0x204,"tocol: ",8);
        builtin_memcpy(puVar9 + (ulong)uVar4 + 0x1f1,"\r\nSe",4);
        builtin_memcpy(puVar9 + (ulong)uVar4 + 0x1f5,"c-We",4);
        builtin_memcpy(puVar9 + (ulong)uVar4 + 0x1f9,"bSoc",4);
        builtin_memcpy(puVar9 + (ulong)uVar4 + 0x1fd,"ket-",4);
        iVar3 = lws_snprintf((char *)(puVar9 + (ulong)uVar4 + 0x20b),0x80,"%s");
        puVar7 = puVar7 + (long)iVar3 + 0x1a;
      }
      puVar7[2] = '\0';
      puVar7[0] = '\r';
      puVar7[1] = '\n';
      local_60 = puVar7 + 2;
      local_54 = (*(int *)ppuVar8 + context->pt_serv_buf_size) - (int)local_60;
      iVar3 = user_callback_handle_rxflow
                        (((wsi->a).protocol)->callback,wsi,LWS_CALLBACK_ADD_HEADERS,wsi->user_space,
                         &local_60,0);
      if (iVar3 != 0) {
        return -1;
      }
      local_60[2] = '\0';
      local_60[0] = '\r';
      local_60[1] = '\n';
      puVar9 = local_60 + (2 - (long)puVar2);
      _lws_log(0x20,"issuing resp pkt %d len\n",(ulong)puVar9 & 0xffffffff);
      uVar4 = lws_write(wsi,puVar2,(size_t)puVar9,LWS_WRITE_HTTP_HEADERS);
      if (uVar4 != (uint)puVar9) {
        _lws_log(8,"%s: ERROR writing to socket %d\n","handshake_0405",(ulong)uVar4);
        return -1;
      }
      lwsi_set_state(wsi,0x119);
      wsi->lws_rx_parse_state = '\0';
      pcVar5 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_GET_URI);
      iVar3 = lws_hdr_total_length(wsi,WSI_TOKEN_GET_URI);
      plVar6 = lws_find_mount(wsi,pcVar5,iVar3);
      if (((plVar6 != (lws_http_mount *)0x0) &&
          (plVar6->cgienv != (lws_protocol_vhost_options *)0x0)) &&
         (iVar3 = (*((wsi->a).protocol)->callback)
                            (wsi,LWS_CALLBACK_HTTP_PMO,wsi->user_space,plVar6->cgienv,0), iVar3 != 0
         )) {
        return 1;
      }
      return 0;
    }
    pcVar5 = "Base64 encoded hash too long\n";
    iVar3 = 2;
  }
  _lws_log(iVar3,pcVar5);
  return -1;
}

Assistant:

int
handshake_0405(struct lws_context *context, struct lws *wsi)
{
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_process_html_args args;
	unsigned char hash[20];
	int n, accept_len;
	char *response;
	char *p;

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_HOST) ||
	    !lws_hdr_total_length(wsi, WSI_TOKEN_KEY)) {
		lwsl_info("handshake_04 missing pieces\n");
		/* completed header processing, but missing some bits */
		goto bail;
	}

	if (lws_hdr_total_length(wsi, WSI_TOKEN_KEY) >=
	    MAX_WEBSOCKET_04_KEY_LEN) {
		lwsl_warn("Client key too long %d\n", MAX_WEBSOCKET_04_KEY_LEN);
		goto bail;
	}

	/*
	 * since key length is restricted above (currently 128), cannot
	 * overflow
	 */
	n = sprintf((char *)pt->serv_buf,
		    "%s258EAFA5-E914-47DA-95CA-C5AB0DC85B11",
		    lws_hdr_simple_ptr(wsi, WSI_TOKEN_KEY));

	lws_SHA1(pt->serv_buf, (unsigned int)n, hash);

	accept_len = lws_b64_encode_string((char *)hash, 20,
			(char *)pt->serv_buf, (int)context->pt_serv_buf_size);
	if (accept_len < 0) {
		lwsl_warn("Base64 encoded hash too long\n");
		goto bail;
	}

	/* allocate the per-connection user memory (if any) */
	if (lws_ensure_user_space(wsi))
		goto bail;

	/* create the response packet */

	/* make a buffer big enough for everything */

	response = (char *)pt->serv_buf + MAX_WEBSOCKET_04_KEY_LEN +
		   256 + LWS_PRE;
	p = response;
	LWS_CPYAPP(p, "HTTP/1.1 101 Switching Protocols\x0d\x0a"
		      "Upgrade: WebSocket\x0d\x0a"
		      "Connection: Upgrade\x0d\x0a"
		      "Sec-WebSocket-Accept: ");
	strcpy(p, (char *)pt->serv_buf);
	p += accept_len;

	/* we can only return the protocol header if:
	 *  - one came in, and ... */
	if (lws_hdr_total_length(wsi, WSI_TOKEN_PROTOCOL) &&
	    /*  - it is not an empty string */
	    wsi->a.protocol->name &&
	    wsi->a.protocol->name[0]) {
		const char *prot = wsi->a.protocol->name;

#if defined(LWS_WITH_HTTP_PROXY)
		if (wsi->proxied_ws_parent && wsi->child_list)
			prot = wsi->child_list->ws->actual_protocol;
#endif

#if defined(LWS_WITH_SECURE_STREAMS) && defined(LWS_WITH_SERVER)
		{
			lws_ss_handle_t *sssh = wsi->a.vhost->ss_handle;

			/*
			 * At the moment, once we see it's a ss ws server, whatever
			 * he asked for we bind him to the ss-ws protocol handler.
			 *
			 * In the response subprotocol header, we need to name
			 *
			 * sssh->policy->u.http.u.ws.subprotocol
			 *
			 * though...
			 */

			if (sssh && sssh->policy &&
			    sssh->policy->u.http.u.ws.subprotocol)
				prot = sssh->policy->u.http.u.ws.subprotocol;
		}
#endif

		LWS_CPYAPP(p, "\x0d\x0aSec-WebSocket-Protocol: ");
		p += lws_snprintf(p, 128, "%s", prot);
	}

#if !defined(LWS_WITHOUT_EXTENSIONS)
	/*
	 * Figure out which extensions the client has that we want to
	 * enable on this connection, and give him back the list.
	 *
	 * Give him a limited write bugdet
	 */
	if (lws_extension_server_handshake(wsi, &p, 192))
		goto bail;
#endif
	LWS_CPYAPP(p, "\x0d\x0a");

	args.p = p;
	args.max_len = lws_ptr_diff((char *)pt->serv_buf +
				    context->pt_serv_buf_size, p);
	if (user_callback_handle_rxflow(wsi->a.protocol->callback, wsi,
					LWS_CALLBACK_ADD_HEADERS,
					wsi->user_space, &args, 0))
		goto bail;

	p = args.p;

	/* end of response packet */

	LWS_CPYAPP(p, "\x0d\x0a");

	/* okay send the handshake response accepting the connection */

	lwsl_parser("issuing resp pkt %d len\n",
		    lws_ptr_diff(p, response));
#if defined(DEBUG)
	fwrite(response, 1,  p - response, stderr);
#endif
	n = lws_write(wsi, (unsigned char *)response, lws_ptr_diff_size_t(p, response),
		      LWS_WRITE_HTTP_HEADERS);
	if (n != lws_ptr_diff(p, response)) {
		lwsl_info("%s: ERROR writing to socket %d\n", __func__, n);
		goto bail;
	}

	/* alright clean up and set ourselves into established state */

	lwsi_set_state(wsi, LRS_ESTABLISHED);
	wsi->lws_rx_parse_state = LWS_RXPS_NEW;

	{
		const char * uri_ptr =
			lws_hdr_simple_ptr(wsi, WSI_TOKEN_GET_URI);
		int uri_len = lws_hdr_total_length(wsi, WSI_TOKEN_GET_URI);
		const struct lws_http_mount *hit =
			lws_find_mount(wsi, uri_ptr, uri_len);
		if (hit && hit->cgienv &&
		    wsi->a.protocol->callback(wsi, LWS_CALLBACK_HTTP_PMO,
			wsi->user_space, (void *)hit->cgienv, 0))
			return 1;
	}

	return 0;

bail:
	/* caller will free up his parsing allocations */
	return -1;
}